

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

bool duckdb_re2::IsAnchorStart(Regexp **pre,int depth)

{
  bool bVar1;
  RegexpOp RVar2;
  int iVar3;
  Regexp **ppRVar4;
  Regexp *pRVar5;
  Regexp *pRVar6;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  int i;
  PODArray<duckdb_re2::Regexp_*> subcopy;
  Regexp *sub;
  Regexp *re;
  ParseFlags in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  PODArray<duckdb_re2::Regexp_*> *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff68;
  ParseFlags in_stack_ffffffffffffff6c;
  Regexp *in_stack_ffffffffffffff70;
  Rune *in_stack_ffffffffffffff78;
  Regexp *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb0;
  int local_48;
  Regexp *local_28;
  undefined8 this;
  undefined4 in_stack_ffffffffffffffe8;
  
  this = *in_RDI;
  if (((Regexp *)this != (Regexp *)0x0) && ((int)in_ESI < 4)) {
    RVar2 = Regexp::op((Regexp *)this);
    if (RVar2 == kRegexpConcat) {
      iVar3 = Regexp::nsub((Regexp *)this);
      if (0 < iVar3) {
        Regexp::sub((Regexp *)this);
        local_28 = Regexp::Incref(in_stack_ffffffffffffff98);
        bVar1 = IsAnchorStart((Regexp **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),SUB84(this,4));
        if (bVar1) {
          Regexp::nsub((Regexp *)this);
          pRVar6 = (Regexp *)&stack0xffffffffffffffc8;
          PODArray<duckdb_re2::Regexp_*>::PODArray
                    ((PODArray<duckdb_re2::Regexp_*> *)in_stack_ffffffffffffff70,
                     in_stack_ffffffffffffff6c);
          pRVar5 = local_28;
          ppRVar4 = PODArray<duckdb_re2::Regexp_*>::operator[]
                              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
          *ppRVar4 = pRVar5;
          for (local_48 = 1; iVar3 = Regexp::nsub((Regexp *)this), local_48 < iVar3;
              local_48 = local_48 + 1) {
            Regexp::sub((Regexp *)this);
            pRVar5 = Regexp::Incref(pRVar6);
            ppRVar4 = PODArray<duckdb_re2::Regexp_*>::operator[]
                                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
            *ppRVar4 = pRVar5;
          }
          PODArray<duckdb_re2::Regexp_*>::data((PODArray<duckdb_re2::Regexp_*> *)0x81825c);
          Regexp::nsub((Regexp *)this);
          Regexp::parse_flags((Regexp *)this);
          pRVar6 = Regexp::Concat((Regexp **)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                                  in_stack_ffffffffffffff48);
          *in_RDI = pRVar6;
          Regexp::Decref((Regexp *)CONCAT44(RVar2,in_stack_ffffffffffffffb0));
          PODArray<duckdb_re2::Regexp_*>::~PODArray((PODArray<duckdb_re2::Regexp_*> *)0x8182ce);
          return true;
        }
        Regexp::Decref((Regexp *)CONCAT44(RVar2,in_stack_ffffffffffffffb0));
      }
    }
    else if (RVar2 == kRegexpCapture) {
      Regexp::sub((Regexp *)this);
      local_28 = Regexp::Incref(in_stack_ffffffffffffff98);
      bVar1 = IsAnchorStart((Regexp **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),SUB84(this,4));
      if (bVar1) {
        Regexp::parse_flags((Regexp *)this);
        Regexp::cap((Regexp *)this);
        pRVar6 = Regexp::Capture(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                                 in_stack_ffffffffffffff68);
        *in_RDI = pRVar6;
        Regexp::Decref((Regexp *)CONCAT44(RVar2,in_stack_ffffffffffffffb0));
        return true;
      }
      Regexp::Decref((Regexp *)CONCAT44(RVar2,in_stack_ffffffffffffffb0));
    }
    else if (RVar2 == kRegexpBeginText) {
      Regexp::parse_flags((Regexp *)this);
      pRVar6 = Regexp::LiteralString
                         (in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                          (ParseFlags)in_stack_ffffffffffffff70);
      *in_RDI = pRVar6;
      Regexp::Decref((Regexp *)CONCAT44(RVar2,in_stack_ffffffffffffffb0));
      return true;
    }
    return false;
  }
  return false;
}

Assistant:

static bool IsAnchorStart(Regexp** pre, int depth) {
  Regexp* re = *pre;
  Regexp* sub;
  // The depth limit makes sure that we don't overflow
  // the stack on a deeply nested regexp.  As the comment
  // above says, IsAnchorStart is conservative, so returning
  // a false negative is okay.  The exact limit is somewhat arbitrary.
  if (re == NULL || depth >= 4)
    return false;
  switch (re->op()) {
    default:
      break;
    case kRegexpConcat:
      if (re->nsub() > 0) {
        sub = re->sub()[0]->Incref();
        if (IsAnchorStart(&sub, depth+1)) {
          PODArray<Regexp*> subcopy(re->nsub());
          subcopy[0] = sub;  // already have reference
          for (int i = 1; i < re->nsub(); i++)
            subcopy[i] = re->sub()[i]->Incref();
          *pre = Regexp::Concat(subcopy.data(), re->nsub(), re->parse_flags());
          re->Decref();
          return true;
        }
        sub->Decref();
      }
      break;
    case kRegexpCapture:
      sub = re->sub()[0]->Incref();
      if (IsAnchorStart(&sub, depth+1)) {
        *pre = Regexp::Capture(sub, re->parse_flags(), re->cap());
        re->Decref();
        return true;
      }
      sub->Decref();
      break;
    case kRegexpBeginText:
      *pre = Regexp::LiteralString(NULL, 0, re->parse_flags());
      re->Decref();
      return true;
  }
  return false;
}